

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O2

int32_t __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::internalPrev
          (SimpleFilteredSentenceBreakIterator *this,int32_t n)

{
  EFBMatchResult EVar1;
  UErrorCode status;
  
  if ((1 < n + 1U) &&
     ((this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>.ptr !=
      (UCharsTrie *)0x0)) {
    status = U_ZERO_ERROR;
    resetState(this,&status);
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      while (n - 1U < 0xfffffffe) {
        EVar1 = breakExceptionAt(this,n);
        if (EVar1 == kNoExceptionHere) {
          return n;
        }
        n = (*(((this->fDelegate).super_LocalPointerBase<icu_63::BreakIterator>.ptr)->super_UObject)
              ._vptr_UObject[0xc])();
      }
    }
    else {
      n = -1;
    }
  }
  return n;
}

Assistant:

int32_t
SimpleFilteredSentenceBreakIterator::internalPrev(int32_t n) {
  if(n == 0 || n == UBRK_DONE || // at end  or
    fData->fBackwardsTrie.isNull()) { // .. no backwards table loaded == no exceptions
      return n;
  }
  // OK, do we need to break here?
  UErrorCode status = U_ZERO_ERROR;
  // refresh text
  resetState(status);
  if(U_FAILURE(status)) return UBRK_DONE; // bail out

  //if(debug2) u_printf("str, native len=%d\n", utext_nativeLength(fText.getAlias()));
  while (n != UBRK_DONE && n != 0) { // outer loop runs once per underlying break (from fDelegate).
    SimpleFilteredSentenceBreakIterator::EFBMatchResult m = breakExceptionAt(n);

    switch(m) {
    case kExceptionHere:
      n = fDelegate->previous(); // skip this one. Find the next lowerlevel break.
      continue;

    default:
    case kNoExceptionHere:
      return n;
    }    
  }
  return n;
}